

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

int armci_stride_info_seg_off(stride_info_t *sinfo)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (sinfo != (stride_info_t *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)sinfo->stride_levels;
    if (sinfo->stride_levels < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = iVar1 + sinfo->stride_arr[uVar3] * sinfo->itr[uVar3];
    }
    return iVar1;
  }
  __assert_fail("sinfo!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0x89,"int armci_stride_info_seg_off(stride_info_t *)");
}

Assistant:

int armci_stride_info_seg_off(stride_info_t *sinfo) {
  int i;
  int off;
  assert(sinfo!=NULL);
  
  off=0;
  for(i=0; i<sinfo->stride_levels; i++) {
    off += sinfo->itr[i] * sinfo->stride_arr[i];
  }
  return off;
}